

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,REF_DBL *diagonal)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  REF_DBL RVar10;
  REF_DBL temp;
  REF_DBL max_xyz [3];
  REF_DBL min_xyz [3];
  undefined8 local_80;
  double local_78 [4];
  double local_58 [4];
  REF_DBL *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  lVar5 = 0;
  do {
    local_58[lVar5] = 1e+200;
    local_78[lVar5] = -1e+200;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  iVar1 = ref_node->max;
  if (0 < (long)iVar1) {
    pRVar2 = ref_node->global;
    lVar5 = 0;
    lVar7 = 0;
    do {
      if (-1 < pRVar2[lVar7]) {
        pRVar3 = ref_node->real;
        lVar6 = 0;
        do {
          dVar9 = *(double *)((long)pRVar3 + lVar6 * 8 + lVar5);
          dVar8 = local_58[lVar6];
          if (dVar9 <= local_58[lVar6]) {
            dVar8 = dVar9;
          }
          local_58[lVar6] = dVar8;
          dVar9 = *(double *)((long)pRVar3 + lVar6 * 8 + lVar5);
          dVar8 = local_78[lVar6];
          if (local_78[lVar6] <= dVar9) {
            dVar8 = dVar9;
          }
          local_78[lVar6] = dVar8;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0x78;
    } while (lVar7 != iVar1);
  }
  lVar5 = 0;
  local_38 = diagonal;
  while( true ) {
    local_80 = *(undefined8 *)((long)local_58 + lVar5);
    uVar4 = ref_mpi_min(ref_mpi,&local_80,(undefined8 *)((long)local_58 + lVar5),3);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xd26,
             "ref_node_bounding_box_diagonal",(ulong)uVar4,"mpi min");
      return uVar4;
    }
    local_80 = *(undefined8 *)((long)local_78 + lVar5);
    uVar4 = ref_mpi_max(ref_mpi,&local_80,(undefined8 *)((long)local_78 + lVar5),3);
    pRVar3 = local_38;
    if (uVar4 != 0) break;
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x18) {
      if (ref_mpi->id == 0) {
        dVar9 = (local_78[2] - local_58[2]) * (local_78[2] - local_58[2]) +
                (local_78[1] - local_58[1]) * (local_78[1] - local_58[1]) +
                (local_78[0] - local_58[0]) * (local_78[0] - local_58[0]);
        if (dVar9 < 0.0) {
          RVar10 = sqrt(dVar9);
        }
        else {
          RVar10 = SQRT(dVar9);
        }
        *pRVar3 = RVar10;
      }
      uVar4 = ref_mpi_bcast(ref_mpi,pRVar3,1,3);
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xd2f,"ref_node_bounding_box_diagonal",(ulong)uVar4,"bcast");
      }
      return uVar4;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xd28,
         "ref_node_bounding_box_diagonal",(ulong)uVar4,"mpi max");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,
                                                  REF_DBL *diagonal) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_DBL min_xyz[3], max_xyz[3], temp;
  REF_INT node, i;
  for (i = 0; i < 3; i++) {
    min_xyz[i] = REF_DBL_MAX;
    max_xyz[i] = REF_DBL_MIN;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      min_xyz[i] = MIN(min_xyz[i], ref_node_xyz(ref_node, i, node));
      max_xyz[i] = MAX(max_xyz[i], ref_node_xyz(ref_node, i, node));
    }
  }
  for (i = 0; i < 3; i++) {
    temp = min_xyz[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(min_xyz[i]), REF_DBL_TYPE), "mpi min");
    temp = max_xyz[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(max_xyz[i]), REF_DBL_TYPE), "mpi max");
  }
  if (ref_mpi_once(ref_mpi)) {
    *diagonal =
        sqrt(pow(max_xyz[0] - min_xyz[0], 2) + pow(max_xyz[1] - min_xyz[1], 2) +
             pow(max_xyz[2] - min_xyz[2], 2));
  }
  RSS(ref_mpi_bcast(ref_mpi, diagonal, 1, REF_DBL_TYPE), "bcast");
  return REF_SUCCESS;
}